

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QByteArray * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>
::convertTo<QByteArray>
          (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>
           *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  DataPointer *this_00;
  char *pcVar4;
  qsizetype in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QByteArray *s;
  iterator d;
  char **in_stack_ffffffffffffff88;
  type *in_stack_ffffffffffffff90;
  QByteArray *pQVar5;
  QByteArray *in_stack_ffffffffffffffb8;
  char *pcVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = in_RDI;
  bVar2 = isNull(in_stack_ffffffffffffff90);
  if (bVar2) {
    QByteArray::QByteArray((QByteArray *)0x2d209c);
  }
  else {
    qVar3 = QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>_>
            ::size(in_stack_ffffffffffffff90);
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray(in_stack_ffffffffffffffb8,in_RSI,(Initialization)((ulong)pQVar5 >> 0x20))
    ;
    this_00 = QByteArray::data_ptr(in_RDI);
    pcVar4 = QArrayDataPointer<char>::data(this_00);
    pcVar6 = pcVar4;
    QConcatenable<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QByteArray,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>,_QByteArray>,_char>_>
    ::appendTo<char>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (qVar3 != (long)pcVar4 - (long)pcVar6) {
      QByteArray::resize(in_RDI,(qsizetype)this_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar5;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }